

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XLearnSetInt(XL *out,char *key,int value)

{
  XLearn *this;
  int iVar1;
  HyperParam *pHVar2;
  index_t in_EDX;
  char *in_RSI;
  undefined8 *in_RDI;
  runtime_error *_except_;
  XLearn *xl;
  
  this = (XLearn *)*in_RDI;
  iVar1 = strcmp(in_RSI,"k");
  if (iVar1 == 0) {
    pHVar2 = XLearn::GetHyperParam(this);
    pHVar2->num_K = in_EDX;
  }
  else {
    iVar1 = strcmp(in_RSI,"epoch");
    if (iVar1 == 0) {
      pHVar2 = XLearn::GetHyperParam(this);
      pHVar2->num_epoch = in_EDX;
    }
    else {
      iVar1 = strcmp(in_RSI,"fold");
      if (iVar1 == 0) {
        pHVar2 = XLearn::GetHyperParam(this);
        pHVar2->num_folds = in_EDX;
      }
      else {
        iVar1 = strcmp(in_RSI,"block_size");
        if (iVar1 == 0) {
          pHVar2 = XLearn::GetHyperParam(this);
          pHVar2->block_size = in_EDX;
        }
        else {
          iVar1 = strcmp(in_RSI,"nthread");
          if (iVar1 == 0) {
            pHVar2 = XLearn::GetHyperParam(this);
            pHVar2->thread_number = in_EDX;
          }
          else {
            iVar1 = strcmp(in_RSI,"stop_window");
            if (iVar1 == 0) {
              pHVar2 = XLearn::GetHyperParam(this);
              pHVar2->stop_window = in_EDX;
            }
            else {
              iVar1 = strcmp(in_RSI,"seed");
              if (iVar1 == 0) {
                pHVar2 = XLearn::GetHyperParam(this);
                pHVar2->seed = in_EDX;
              }
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

XL_DLL int XLearnSetInt(XL *out, const char *key, const int value) {
  API_BEGIN();
  XLearn* xl = reinterpret_cast<XLearn*>(*out);
  if (strcmp(key, "k") == 0) {
    xl->GetHyperParam().num_K = value;
  } else if (strcmp(key, "epoch") == 0) {
    xl->GetHyperParam().num_epoch = value;
  } else if (strcmp(key, "fold") == 0) {
    xl->GetHyperParam().num_folds = value;
  } else if (strcmp(key, "block_size") == 0) {
    xl->GetHyperParam().block_size = value;
  } else if (strcmp(key, "nthread") == 0) {
    xl->GetHyperParam().thread_number = value;
  } else if (strcmp(key, "stop_window") == 0) {
    xl->GetHyperParam().stop_window = value;
  } else if (strcmp(key, "seed") == 0) {
    xl->GetHyperParam().seed = value;
  }
  API_END();
}